

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

Trivia __thiscall
slang::parsing::Preprocessor::handleUnconnectedDriveDirective(Preprocessor *this,Token directive)

{
  Token *pTVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  BumpAllocator *alloc;
  Info *pIVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SourceLocation SVar8;
  UnconnectedDriveDirectiveSyntax *syntax;
  Token TVar9;
  Token local_68;
  Token local_58;
  Token local_48;
  Trivia local_38;
  
  local_58.info = directive.info;
  local_58._0_8_ = directive._0_8_;
  checkOutsideDesignElement(this,directive);
  Token::Token(&local_68);
  if ((this->currentToken).info == (Info *)0x0) {
    TVar9 = nextProcessed(this);
    this->currentToken = TVar9;
  }
  uVar2 = (this->currentToken).kind;
  if ((ushort)(uVar2 - 0xf3) < 2) {
    pTVar1 = &this->currentToken;
    if ((this->currentToken).info == (Info *)0x0) {
      TVar9 = nextProcessed(this);
      this->currentToken = TVar9;
    }
    uVar3 = (this->currentToken).kind;
    TVar9 = this->currentToken;
    uVar5 = pTVar1->field_0x2;
    NVar6.raw = (pTVar1->numFlags).raw;
    uVar7 = pTVar1->rawLen;
    pIVar4 = (this->currentToken).info;
    (this->lastConsumed).kind = pTVar1->kind;
    (this->lastConsumed).field_0x2 = uVar5;
    (this->lastConsumed).numFlags = (NumericTokenFlags)NVar6.raw;
    (this->lastConsumed).rawLen = uVar7;
    (this->lastConsumed).info = pIVar4;
    Token::Token(&local_48);
    pTVar1->kind = local_48.kind;
    pTVar1->field_0x2 = local_48._2_1_;
    pTVar1->numFlags = (NumericTokenFlags)local_48.numFlags.raw;
    pTVar1->rawLen = local_48.rawLen;
    (this->currentToken).info = local_48.info;
    this->unconnectedDrive = uVar3;
    local_68 = TVar9;
  }
  if (local_68.info == (Info *)0x0) {
    if ((this->currentToken).info == (Info *)0x0) {
      TVar9 = nextProcessed(this);
      this->currentToken = TVar9;
    }
    local_48.kind = (this->currentToken).kind;
    local_48._2_1_ = (this->currentToken).field_0x2;
    local_48.numFlags.raw = (this->currentToken).numFlags.raw;
    local_48.rawLen = (this->currentToken).rawLen;
    local_48.info = (this->currentToken).info;
    SVar8 = Token::location(&local_48);
    Diagnostics::add(this->diagnostics,(DiagCode)0x30004,SVar8);
    alloc = this->alloc;
    if ((this->currentToken).info == (Info *)0x0) {
      TVar9 = nextProcessed(this);
      this->currentToken = TVar9;
    }
    local_48.kind = (this->currentToken).kind;
    local_48._2_1_ = (this->currentToken).field_0x2;
    local_48.numFlags.raw = (this->currentToken).numFlags.raw;
    local_48.rawLen = (this->currentToken).rawLen;
    local_48.info = (this->currentToken).info;
    SVar8 = Token::location(&local_48);
    local_68 = Token::createMissing(alloc,Pull0Keyword,SVar8);
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::UnconnectedDriveDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,&local_58,&local_68);
  Trivia::Trivia(&local_38,Directive,(SyntaxNode *)syntax);
  return local_38;
}

Assistant:

Trivia Preprocessor::handleUnconnectedDriveDirective(Token directive) {
    checkOutsideDesignElement(directive);

    Token strength;
    switch (peek().kind) {
        case TokenKind::Pull0Keyword:
        case TokenKind::Pull1Keyword:
            strength = consume();
            unconnectedDrive = strength.kind;
            break;
        default:
            break;
    }

    if (!strength) {
        addDiag(diag::ExpectedDriveStrength, peek().location());
        strength = Token::createMissing(alloc, TokenKind::Pull0Keyword, peek().location());
    }

    auto result = alloc.emplace<UnconnectedDriveDirectiveSyntax>(directive, strength);
    return Trivia(TriviaKind::Directive, result);
}